

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# requantize.cpp
# Opt level: O1

void ncnn::requantize(int *intptr,char *ptr,float scale_in,float bias,float scale_out,
                     int activation_type,Mat *activation_params,int size)

{
  float fVar1;
  float fVar2;
  char cVar3;
  int iVar4;
  long lVar5;
  float fVar6;
  float fVar7;
  float __x;
  
  if (0 < size) {
    lVar5 = 0;
    do {
      __x = (float)intptr[lVar5] * scale_in + bias;
      fVar6 = __x;
      switch(activation_type) {
      case 1:
        if (__x <= 0.0) {
          fVar6 = 0.0;
        }
        break;
      case 2:
        fVar6 = (float)(~-(uint)(0.0 < __x) & *activation_params->data |
                       -(uint)(0.0 < __x) & 0x3f800000) * __x;
        break;
      case 3:
        fVar6 = *activation_params->data;
        if (__x <= fVar6) {
          __x = fVar6;
        }
        fVar6 = *(float *)((long)activation_params->data + 4);
        if (__x <= fVar6) {
          fVar6 = __x;
        }
        break;
      case 4:
        if (88.37626 <= __x) {
          __x = 88.37626;
        }
        fVar6 = expf((float)(-(uint)(__x < -88.37626) & 0x42b0c0a5 |
                            ~-(uint)(__x < -88.37626) & (uint)-__x));
        fVar6 = 1.0 / (fVar6 + 1.0);
        break;
      case 5:
        fVar6 = expf(__x);
        fVar6 = logf(fVar6 + 1.0);
        fVar6 = tanhf(fVar6);
        fVar6 = fVar6 * __x;
        break;
      case 6:
        fVar1 = *activation_params->data;
        fVar2 = *(float *)((long)activation_params->data + 4);
        fVar7 = -fVar2 / fVar1;
        fVar6 = 0.0;
        if ((fVar7 <= __x) && (fVar6 = __x, __x <= fVar7 + 1.0 / fVar1)) {
          fVar6 = (fVar1 * __x + fVar2) * __x;
        }
      }
      fVar6 = roundf(fVar6 * scale_out);
      iVar4 = (int)fVar6;
      if (iVar4 < -0x7e) {
        iVar4 = -0x7f;
      }
      cVar3 = (char)iVar4;
      if (0x7e < iVar4) {
        cVar3 = '\x7f';
      }
      ptr[lVar5] = cVar3;
      lVar5 = lVar5 + 1;
    } while (size != (int)lVar5);
  }
  return;
}

Assistant:

static void requantize(const int* intptr, signed char* ptr, float scale_in, float bias, float scale_out, int activation_type, const Mat& activation_params, int size)
{
    for (int i = 0; i < size; i++)
    {
        float v = *intptr * scale_in + bias;
        v = activation_ss(v, activation_type, activation_params);
        *ptr = float2int8(v * scale_out);
        intptr++;
        ptr++;
    }
}